

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strHex.cpp
# Opt level: O2

int jbcoin::charUnHex(uchar c)

{
  int iVar1;
  int i;
  long lVar2;
  
  if (charUnHex(unsigned_char)::xtab == '\0') {
    iVar1 = __cxa_guard_acquire(&charUnHex(unsigned_char)::xtab);
    if (iVar1 != 0) {
      for (lVar2 = 0; lVar2 != 0x400; lVar2 = lVar2 + 4) {
        *(undefined4 *)((long)charUnHex::xtab.hex + lVar2) = 0xffffffff;
      }
      for (lVar2 = 0; lVar2 != 10; lVar2 = lVar2 + 1) {
        charUnHex::xtab.hex[lVar2 + 0x30] = (int)lVar2;
      }
      for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
        iVar1 = (int)lVar2 + 10;
        charUnHex::xtab.hex[lVar2 + 0x41] = iVar1;
        charUnHex::xtab.hex[lVar2 + 0x61] = iVar1;
      }
      __cxa_guard_release(&charUnHex(unsigned_char)::xtab);
    }
  }
  return charUnHex::xtab.hex[c];
}

Assistant:

int charUnHex (unsigned char c)
{
    struct HexTab
    {
        int hex[256];

        HexTab ()
        {
            std::fill (std::begin (hex), std::end (hex), -1);
            for (int i = 0; i < 10; ++i)
                hex ['0'+i] = i;
            for (int i = 0; i < 6; ++i)
            {
                hex ['A'+i] = 10 + i;
                hex ['a'+i] = 10 + i;
            }
        }
        int operator[] (unsigned char c) const
        {
            return hex[c];
        }
    };

    static HexTab xtab;

    return xtab[c];
}